

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_uri_parameter(char *zFilename,char *zParam)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  
  if (zParam == (char *)0x0 || zFilename == (char *)0x0) {
LAB_001233b7:
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = databaseName((char *)CONCAT71((int7)((ulong)in_RAX >> 8),zFilename == (char *)0x0));
    do {
      uVar1 = sqlite3Strlen30(pcVar3);
      if (pcVar3[(ulong)uVar1 + 1] == '\0') goto LAB_001233b7;
      pcVar3 = pcVar3 + (ulong)uVar1 + 1;
      iVar2 = strcmp(pcVar3,zParam);
      uVar1 = sqlite3Strlen30(pcVar3);
      pcVar3 = pcVar3 + (ulong)uVar1 + 1;
    } while (iVar2 != 0);
  }
  return pcVar3;
}

Assistant:

SQLITE_API const char *sqlite3_uri_parameter(const char *zFilename, const char *zParam){
  if( zFilename==0 || zParam==0 ) return 0;
  zFilename = databaseName(zFilename);
  return uriParameter(zFilename, zParam);
}